

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

MPP_RET init_picture(H264_SLICE_t *currSlice)

{
  h264_dec_ctx_t *phVar1;
  h264d_video_ctx_t *phVar2;
  h264d_dxva_ctx_t *phVar3;
  MPP_RET MVar4;
  bool bVar5;
  H264dDxvaCtx_t *dxva_ctx;
  H264dErrCtx_t *p_err;
  H264dVideoCtx_t *p_Vid;
  H264_DecCtx_t *p_Dec;
  MPP_RET ret;
  H264_SLICE_t *currSlice_local;
  
  phVar1 = currSlice->p_Vid->p_Dec;
  phVar2 = currSlice->p_Vid;
  if (((((phVar1->errctx).i_slice_no == 0) && ((phVar2->recovery).valid_flag != 0)) &&
      ((phVar2->recovery).first_frm_valid != 0)) &&
     ((phVar2->recovery).first_frm_id == currSlice->frame_num)) {
    (phVar1->errctx).i_slice_no = (uint)(currSlice->layer_id == 0) + (phVar1->errctx).i_slice_no;
  }
  else {
    bVar5 = false;
    if (currSlice->layer_id == 0) {
      bVar5 = currSlice->slice_type == 2;
    }
    (phVar1->errctx).i_slice_no = (uint)bVar5 + (phVar1->errctx).i_slice_no;
  }
  if ((phVar1->errctx).i_slice_no == 0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_init","[Discard] Discard slice before I Slice. \n",(char *)0x0);
    }
    p_Dec._4_4_ = MPP_NOK;
  }
  else {
    p_Dec._4_4_ = alloc_decpic(currSlice);
    if (p_Dec._4_4_ < MPP_OK) {
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x814);
      }
    }
    else {
      if (((((phVar1->errctx).i_slice_no < 2) && (currSlice->layer_id == 0)) &&
          (currSlice->slice_type == 2)) || (currSlice->idr_flag != 0)) {
        (phVar1->errctx).first_iframe_poc = phVar2->dec_pic->poc;
        (phVar1->errctx).first_iframe_is_output = 0;
      }
      if (((currSlice->layer_id != 0) && (currSlice->svc_extension_flag == 0)) &&
         ((currSlice->mvcExt).non_idr_flag == 0)) {
        if ((((h264d_debug & 2) != 0) && (currSlice->layer_id != 1)) &&
           (_mpp_log_l(2,"h264d_init","Assertion %s failed at %s:%d\n",(char *)0x0,
                       "currSlice->layer_id == 1","init_picture",0x81c),
           (mpp_debug & 0x10000000) != 0)) {
          abort();
        }
        MVar4 = idr_memory_management(phVar2->p_Dpb_layer[currSlice->layer_id],phVar2->dec_pic);
        if (MVar4 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return MVar4;
          }
          _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x81d);
          return MVar4;
        }
      }
      if (((phVar2->last_pic != (h264_store_pic_t *)0x0) && (phVar2->dec_pic->poc != 0)) &&
         (((phVar2->dec_pic->frame_num <= phVar2->last_pic->frame_num &&
           ((phVar2->dec_pic->poc <= phVar2->last_pic->poc && (phVar2->dec_pic->slice_type == 2))))
          && (phVar2->dec_pic->structure == 3)))) {
        if (currSlice->layer_id == 0) {
          MVar4 = flush_dpb(phVar2->p_Dpb_layer[0],1);
          if (MVar4 < MPP_OK) {
            if ((h264d_debug & 4) == 0) {
              return MVar4;
            }
            _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x827);
            return MVar4;
          }
        }
        else {
          MVar4 = flush_dpb(phVar2->p_Dpb_layer[1],2);
          if (MVar4 < MPP_OK) {
            if ((h264d_debug & 4) == 0) {
              return MVar4;
            }
            _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x829);
            return MVar4;
          }
        }
      }
      update_ref_list(phVar2->p_Dpb_layer[currSlice->layer_id]);
      update_ltref_list(phVar2->p_Dpb_layer[currSlice->layer_id]);
      update_pic_num(currSlice);
      if ((currSlice->idr_flag == 0) || (currSlice->layer_id != 0)) {
        MVar4 = init_lists_p_slice_mvc(currSlice);
        if (MVar4 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return MVar4;
          }
          _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x832);
          return MVar4;
        }
        MVar4 = init_lists_b_slice_mvc(currSlice);
        if (MVar4 < MPP_OK) {
          if ((h264d_debug & 4) == 0) {
            return MVar4;
          }
          _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x833);
          return MVar4;
        }
      }
      prepare_init_dpb_info(currSlice);
      prepare_init_ref_info(currSlice);
      p_Dec._4_4_ = check_refer_dpb_buf_slots(currSlice);
      if (MPP_NOK < p_Dec._4_4_) {
        check_refer_picture_lists(currSlice);
        phVar3 = phVar1->dxva_ctx;
        fill_picparams(currSlice->p_Vid,&phVar3->pp);
        if ((phVar3->pp).scaleing_list_enable_flag != '\0') {
          prepare_init_scanlist(currSlice);
          fill_scanlist(currSlice->p_Vid,&phVar3->qm);
        }
        return MPP_OK;
      }
      if ((h264d_debug & 4) != 0) {
        _mpp_log_l(4,"h264d_init","Function error(%d).\n",(char *)0x0,0x838);
      }
    }
  }
  return p_Dec._4_4_;
}

Assistant:

MPP_RET init_picture(H264_SLICE_t *currSlice)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec   = currSlice->p_Vid->p_Dec;
    H264dVideoCtx_t *p_Vid = currSlice->p_Vid;
    H264dErrCtx_t *p_err   = &p_Dec->errctx;

    //!< discard stream before I_SLICE
    if (!p_err->i_slice_no && p_Vid->recovery.valid_flag && p_Vid->recovery.first_frm_valid &&
        p_Vid->recovery.first_frm_id == currSlice->frame_num) {
        p_err->i_slice_no += (!currSlice->layer_id) ? 1 : 0;
    } else {
        p_err->i_slice_no += ((!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ? 1 : 0;
    }

    if (!p_err->i_slice_no) {
        H264D_WARNNING("[Discard] Discard slice before I Slice. \n");
        ret = MPP_NOK;
        goto __FAILED;
    }
    FUN_CHECK(ret = alloc_decpic(currSlice));
    if (((p_err->i_slice_no < 2) && (!currSlice->layer_id) && (H264_I_SLICE == currSlice->slice_type)) ||
        currSlice->idr_flag) {
        p_err->first_iframe_poc = p_Vid->dec_pic->poc; //!< recoder first i frame poc
        p_err->first_iframe_is_output = 0;
    }
    //!< idr_memory_management MVC_layer, idr_flag==1
    if (currSlice->layer_id && !currSlice->svc_extension_flag && !currSlice->mvcExt.non_idr_flag) {
        ASSERT(currSlice->layer_id == 1);
        FUN_CHECK(ret = idr_memory_management(p_Vid->p_Dpb_layer[currSlice->layer_id], p_Vid->dec_pic));
    }

    // if cur pic i frame poc & frame_num <= last pic, flush dpb.
    if (p_Vid->last_pic != NULL && p_Vid->dec_pic->poc != 0) {
        if (p_Vid->last_pic->frame_num >= p_Vid->dec_pic->frame_num
            && p_Vid->last_pic->poc >= p_Vid->dec_pic->poc
            && p_Vid->dec_pic->slice_type == H264_I_SLICE
            && p_Vid->dec_pic->structure == 3) {
            if (currSlice->layer_id == 0) {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[0], 1));
            } else {
                FUN_CHECK(ret = flush_dpb(p_Vid->p_Dpb_layer[1], 2));
            }
        }
    }
    update_ref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_ltref_list(p_Vid->p_Dpb_layer[currSlice->layer_id]);
    update_pic_num(currSlice);
    //!< reorder
    if (!currSlice->idr_flag || currSlice->layer_id) {
        FUN_CHECK(ret = init_lists_p_slice_mvc(currSlice));
        FUN_CHECK(ret = init_lists_b_slice_mvc(currSlice));
    }
    prepare_init_dpb_info(currSlice);
    prepare_init_ref_info(currSlice);

    FUN_CHECK(ret = check_refer_dpb_buf_slots(currSlice));
    check_refer_picture_lists(currSlice);
    {
        H264dDxvaCtx_t *dxva_ctx = p_Dec->dxva_ctx;

        fill_picparams(currSlice->p_Vid, &dxva_ctx->pp);
        if (dxva_ctx->pp.scaleing_list_enable_flag) {
            prepare_init_scanlist(currSlice);
            fill_scanlist(currSlice->p_Vid, &dxva_ctx->qm);
        }
    }

    return ret = MPP_OK;
__FAILED:
    return ret;
}